

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aticqn.c
# Opt level: O0

void iauAticqn(double ri,double di,iauASTROM *astrom,int n,iauLDBODY *b,double *rc,double *dc)

{
  double *in_RCX;
  double dVar1;
  double after [3];
  double r;
  double r2;
  double before [3];
  double d [3];
  double w;
  double pco [3];
  double pnat [3];
  double ppr [3];
  double pi [3];
  int i;
  int j;
  double dStackY_128;
  double *in_stack_fffffffffffffee0;
  double in_stack_fffffffffffffee8;
  double in_stack_fffffffffffffef0;
  double local_100;
  double local_f8;
  double *in_stack_ffffffffffffff10;
  double *in_stack_ffffffffffffff18;
  double *in_stack_ffffffffffffff20;
  double *in_stack_ffffffffffffff28;
  double (*in_stack_ffffffffffffff30) [3];
  double in_stack_ffffffffffffff38;
  double in_stack_ffffffffffffff40;
  double *in_stack_ffffffffffffff48;
  double *in_stack_ffffffffffffff50;
  double *in_stack_ffffffffffffff58;
  double *in_stack_ffffffffffffff60;
  iauLDBODY *in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff74;
  double local_78 [7];
  int local_40;
  int local_3c;
  double *local_30;
  
  local_30 = in_RCX;
  iauS2c(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,in_stack_fffffffffffffee0);
  iauTrxp(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
  iauZp((double *)&stack0xffffffffffffff28);
  for (local_3c = 0; local_3c < 2; local_3c = local_3c + 1) {
    local_100 = 0.0;
    for (local_40 = 0; local_40 < 3; local_40 = local_40 + 1) {
      in_stack_ffffffffffffff40 =
           local_78[local_40] - *(double *)(&stack0xffffffffffffff28 + (long)local_40 * 8);
      (&local_f8)[local_40] = in_stack_ffffffffffffff40;
      local_100 = in_stack_ffffffffffffff40 * in_stack_ffffffffffffff40 + local_100;
    }
    dVar1 = sqrt(local_100);
    for (local_40 = 0; local_40 < 3; local_40 = local_40 + 1) {
      (&local_f8)[local_40] = (&local_f8)[local_40] / dVar1;
    }
    iauAb(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,
          in_stack_ffffffffffffff38,*in_stack_ffffffffffffff30);
    local_100 = 0.0;
    for (local_40 = 0; local_40 < 3; local_40 = local_40 + 1) {
      *(double *)(&stack0xffffffffffffff28 + (long)local_40 * 8) =
           (&dStackY_128)[local_40] - (&local_f8)[local_40];
      in_stack_ffffffffffffff40 =
           local_78[local_40] - *(double *)(&stack0xffffffffffffff28 + (long)local_40 * 8);
      local_78[(long)local_40 + -4] = in_stack_ffffffffffffff40;
      local_100 = in_stack_ffffffffffffff40 * in_stack_ffffffffffffff40 + local_100;
    }
    dVar1 = sqrt(local_100);
    for (local_40 = 0; local_40 < 3; local_40 = local_40 + 1) {
      local_78[(long)local_40 + -4] = local_78[(long)local_40 + -4] / dVar1;
    }
  }
  iauZp((double *)&stack0xffffffffffffff28);
  for (local_3c = 0; local_3c < 5; local_3c = local_3c + 1) {
    local_100 = 0.0;
    for (local_40 = 0; local_40 < 3; local_40 = local_40 + 1) {
      dVar1 = local_78[(long)local_40 + -4] -
              *(double *)(&stack0xffffffffffffff28 + (long)local_40 * 8);
      (&local_f8)[local_40] = dVar1;
      local_100 = dVar1 * dVar1 + local_100;
    }
    dVar1 = sqrt(local_100);
    for (local_40 = 0; local_40 < 3; local_40 = local_40 + 1) {
      (&local_f8)[local_40] = (&local_f8)[local_40] / dVar1;
    }
    iauLdn(in_stack_ffffffffffffff74,in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,
           in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
    local_100 = 0.0;
    for (local_40 = 0; local_40 < 3; local_40 = local_40 + 1) {
      *(double *)(&stack0xffffffffffffff28 + (long)local_40 * 8) =
           (&dStackY_128)[local_40] - (&local_f8)[local_40];
      dVar1 = local_78[(long)local_40 + -4] -
              *(double *)(&stack0xffffffffffffff28 + (long)local_40 * 8);
      *(double *)(&stack0xffffffffffffff48 + (long)local_40 * 8) = dVar1;
      local_100 = dVar1 * dVar1 + local_100;
    }
    dVar1 = sqrt(local_100);
    for (local_40 = 0; local_40 < 3; local_40 = local_40 + 1) {
      *(double *)(&stack0xffffffffffffff48 + (long)local_40 * 8) =
           *(double *)(&stack0xffffffffffffff48 + (long)local_40 * 8) / dVar1;
    }
  }
  iauC2s(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
  dVar1 = iauAnp((double)in_stack_fffffffffffffee0);
  *local_30 = dVar1;
  return;
}

Assistant:

void iauAticqn(double ri, double di, iauASTROM *astrom,
               int n, iauLDBODY b[], double *rc, double *dc)
/*
**  - - - - - - - - - -
**   i a u A t i c q n
**  - - - - - - - - - -
**
**  Quick CIRS to ICRS astrometric place transformation, given the star-
**  independent astrometry parameters plus a list of light-deflecting
**  bodies.
**
**  Use of this function is appropriate when efficiency is important and
**  where many star positions are all to be transformed for one date.
**  The star-independent astrometry parameters can be obtained by
**  calling one of the functions iauApci[13], iauApcg[13], iauApco[13]
**  or iauApcs[13].
*
*  If the only light-deflecting body to be taken into account is the
*  Sun, the iauAticq function can be used instead.
**
**  This function is part of the International Astronomical Union's
**  SOFA (Standards of Fundamental Astronomy) software collection.
**
**  Status:  support function.
**
**  Given:
**     ri,di  double      CIRS RA,Dec (radians)
**     astrom iauASTROM*  star-independent astrometry parameters:
**      pmt    double       PM time interval (SSB, Julian years)
**      eb     double[3]    SSB to observer (vector, au)
**      eh     double[3]    Sun to observer (unit vector)
**      em     double       distance from Sun to observer (au)
**      v      double[3]    barycentric observer velocity (vector, c)
**      bm1    double       sqrt(1-|v|^2): reciprocal of Lorenz factor
**      bpn    double[3][3] bias-precession-nutation matrix
**      along  double       longitude + s' (radians)
**      xpl    double       polar motion xp wrt local meridian (radians)
**      ypl    double       polar motion yp wrt local meridian (radians)
**      sphi   double       sine of geodetic latitude
**      cphi   double       cosine of geodetic latitude
**      diurab double       magnitude of diurnal aberration vector
**      eral   double       "local" Earth rotation angle (radians)
**      refa   double       refraction constant A (radians)
**      refb   double       refraction constant B (radians)
**     n      int          number of bodies (Note 3)
**     b      iauLDBODY[n] data for each of the n bodies (Notes 3,4):
**      bm     double       mass of the body (solar masses, Note 5)
**      dl     double       deflection limiter (Note 6)
**      pv     [2][3]       barycentric PV of the body (au, au/day)
**
**  Returned:
**     rc,dc  double     ICRS astrometric RA,Dec (radians)
**
**  Notes:
**
**  1) Iterative techniques are used for the aberration and light
**     deflection corrections so that the functions iauAticqn and
**     iauAtciqn are accurate inverses; even at the edge of the Sun's
**     disk the discrepancy is only about 1 nanoarcsecond.
**
**  2) If the only light-deflecting body to be taken into account is the
**     Sun, the iauAticq function can be used instead.
**
**  3) The struct b contains n entries, one for each body to be
**     considered.  If n = 0, no gravitational light deflection will be
**     applied, not even for the Sun.
**
**  4) The struct b should include an entry for the Sun as well as for
**     any planet or other body to be taken into account.  The entries
**     should be in the order in which the light passes the body.
**
**  5) In the entry in the b struct for body i, the mass parameter
**     b[i].bm can, as required, be adjusted in order to allow for such
**     effects as quadrupole field.
**
**  6) The deflection limiter parameter b[i].dl is phi^2/2, where phi is
**     the angular separation (in radians) between star and body at
**     which limiting is applied.  As phi shrinks below the chosen
**     threshold, the deflection is artificially reduced, reaching zero
**     for phi = 0.   Example values suitable for a terrestrial
**     observer, together with masses, are as follows:
**
**        body i     b[i].bm        b[i].dl
**
**        Sun        1.0            6e-6
**        Jupiter    0.00095435     3e-9
**        Saturn     0.00028574     3e-10
**
**  7) For efficiency, validation of the contents of the b array is
**     omitted.  The supplied masses must be greater than zero, the
**     position and velocity vectors must be right, and the deflection
**     limiter greater than zero.
**
**  Called:
**     iauS2c       spherical coordinates to unit vector
**     iauTrxp      product of transpose of r-matrix and p-vector
**     iauZp        zero p-vector
**     iauAb        stellar aberration
**     iauLdn       light deflection by n bodies
**     iauC2s       p-vector to spherical
**     iauAnp       normalize angle into range +/- pi
**
**  This revision:   2021 January 6
**
**  SOFA release 2021-05-12
**
**  Copyright (C) 2021 IAU SOFA Board.  See notes at end.
*/
{
   int j, i;
   double pi[3], ppr[3], pnat[3], pco[3], w, d[3], before[3], r2, r,
          after[3];


/* CIRS RA,Dec to Cartesian. */
   iauS2c(ri, di, pi);

/* Bias-precession-nutation, giving GCRS proper direction. */
   iauTrxp(astrom->bpn, pi, ppr);

/* Aberration, giving GCRS natural direction. */
   iauZp(d);
   for (j = 0; j < 2; j++) {
      r2 = 0.0;
      for (i = 0; i < 3; i++) {
         w = ppr[i] - d[i];
         before[i] = w;
         r2 += w*w;
      }
      r = sqrt(r2);
      for (i = 0; i < 3; i++) {
         before[i] /= r;
      }
      iauAb(before, astrom->v, astrom->em, astrom->bm1, after);
      r2 = 0.0;
      for (i = 0; i < 3; i++) {
         d[i] = after[i] - before[i];
         w = ppr[i] - d[i];
         pnat[i] = w;
         r2 += w*w;
      }
      r = sqrt(r2);
      for (i = 0; i < 3; i++) {
         pnat[i] /= r;
      }
   }

/* Light deflection, giving BCRS coordinate direction. */
   iauZp(d);
   for (j = 0; j < 5; j++) {
      r2 = 0.0;
      for (i = 0; i < 3; i++) {
         w = pnat[i] - d[i];
         before[i] = w;
         r2 += w*w;
      }
      r = sqrt(r2);
      for (i = 0; i < 3; i++) {
         before[i] /= r;
      }
      iauLdn(n, b, astrom->eb, before, after);
      r2 = 0.0;
      for (i = 0; i < 3; i++) {
         d[i] = after[i] - before[i];
         w = pnat[i] - d[i];
         pco[i] = w;
         r2 += w*w;
      }
      r = sqrt(r2);
      for (i = 0; i < 3; i++) {
         pco[i] /= r;
      }
   }

/* ICRS astrometric RA,Dec. */
   iauC2s(pco, &w, dc);
   *rc = iauAnp(w);

/* Finished. */

/*----------------------------------------------------------------------
**
**  Copyright (C) 2021
**  Standards Of Fundamental Astronomy Board
**  of the International Astronomical Union.
**
**  =====================
**  SOFA Software License
**  =====================
**
**  NOTICE TO USER:
**
**  BY USING THIS SOFTWARE YOU ACCEPT THE FOLLOWING SIX TERMS AND
**  CONDITIONS WHICH APPLY TO ITS USE.
**
**  1. The Software is owned by the IAU SOFA Board ("SOFA").
**
**  2. Permission is granted to anyone to use the SOFA software for any
**     purpose, including commercial applications, free of charge and
**     without payment of royalties, subject to the conditions and
**     restrictions listed below.
**
**  3. You (the user) may copy and distribute SOFA source code to others,
**     and use and adapt its code and algorithms in your own software,
**     on a world-wide, royalty-free basis.  That portion of your
**     distribution that does not consist of intact and unchanged copies
**     of SOFA source code files is a "derived work" that must comply
**     with the following requirements:
**
**     a) Your work shall be marked or carry a statement that it
**        (i) uses routines and computations derived by you from
**        software provided by SOFA under license to you; and
**        (ii) does not itself constitute software provided by and/or
**        endorsed by SOFA.
**
**     b) The source code of your derived work must contain descriptions
**        of how the derived work is based upon, contains and/or differs
**        from the original SOFA software.
**
**     c) The names of all routines in your derived work shall not
**        include the prefix "iau" or "sofa" or trivial modifications
**        thereof such as changes of case.
**
**     d) The origin of the SOFA components of your derived work must
**        not be misrepresented;  you must not claim that you wrote the
**        original software, nor file a patent application for SOFA
**        software or algorithms embedded in the SOFA software.
**
**     e) These requirements must be reproduced intact in any source
**        distribution and shall apply to anyone to whom you have
**        granted a further right to modify the source code of your
**        derived work.
**
**     Note that, as originally distributed, the SOFA software is
**     intended to be a definitive implementation of the IAU standards,
**     and consequently third-party modifications are discouraged.  All
**     variations, no matter how minor, must be explicitly marked as
**     such, as explained above.
**
**  4. You shall not cause the SOFA software to be brought into
**     disrepute, either by misuse, or use for inappropriate tasks, or
**     by inappropriate modification.
**
**  5. The SOFA software is provided "as is" and SOFA makes no warranty
**     as to its use or performance.   SOFA does not and cannot warrant
**     the performance or results which the user may obtain by using the
**     SOFA software.  SOFA makes no warranties, express or implied, as
**     to non-infringement of third party rights, merchantability, or
**     fitness for any particular purpose.  In no event will SOFA be
**     liable to the user for any consequential, incidental, or special
**     damages, including any lost profits or lost savings, even if a
**     SOFA representative has been advised of such damages, or for any
**     claim by any third party.
**
**  6. The provision of any version of the SOFA software under the terms
**     and conditions specified herein does not imply that future
**     versions will also be made available under the same terms and
**     conditions.
*
**  In any published work or commercial product which uses the SOFA
**  software directly, acknowledgement (see www.iausofa.org) is
**  appreciated.
**
**  Correspondence concerning SOFA software should be addressed as
**  follows:
**
**      By email:  sofa@ukho.gov.uk
**      By post:   IAU SOFA Center
**                 HM Nautical Almanac Office
**                 UK Hydrographic Office
**                 Admiralty Way, Taunton
**                 Somerset, TA1 2DN
**                 United Kingdom
**
**--------------------------------------------------------------------*/
}